

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

Reg ra_rematk(ASMState *as,IRRef ref)

{
  byte bVar1;
  uint rr;
  IRIns *pIVar2;
  uint in_ESI;
  ASMState *in_RDI;
  Reg r;
  IRIns *ir;
  undefined4 in_stack_ffffffffffffffe0;
  Reg r_00;
  undefined4 in_stack_fffffffffffffff0;
  
  pIVar2 = in_RDI->ir + in_ESI;
  bVar1 = (pIVar2->field_1).r;
  rr = (uint)bVar1;
  in_RDI->freeset = 1 << (bVar1 & 0x1f) | in_RDI->freeset;
  in_RDI->modset = 1 << (bVar1 & 0x1f) | in_RDI->modset;
  (pIVar2->field_1).r = 0xff;
  r_00 = (Reg)((ulong)pIVar2 >> 0x20);
  if ((pIVar2->field_1).o == '\x1c') {
    emit_loadk64((ASMState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),r_00,
                 (IRIns *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
  }
  else if ((pIVar2->field_1).o == '\r') {
    (pIVar2->field_1).r = 0x82;
    emit_rma(in_RDI,XO_MOV,rr,in_RDI->J[-1].bpropcache + 0xc);
  }
  else if ((pIVar2->field_1).o == '\x16') {
    emit_rma(in_RDI,XO_MOV,rr,in_RDI->J[-1].bpropcache + 0xb);
  }
  else if ((pIVar2->field_1).o == '\x1d') {
    emit_loadu64((ASMState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),r_00,
                 (ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
  }
  else {
    emit_loadi((ASMState *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),r_00,(int32_t)pIVar2);
  }
  return rr;
}

Assistant:

static Reg ra_rematk(ASMState *as, IRRef ref)
{
  IRIns *ir;
  Reg r;
  if (ra_iskref(ref)) {
    r = ra_krefreg(ref);
    lj_assertA(!rset_test(as->freeset, r), "rematk of free reg %d", r);
    ra_free(as, r);
    ra_modified(as, r);
#if LJ_64
    emit_loadu64(as, r, ra_krefk(as, ref));
#else
    emit_loadi(as, r, ra_krefk(as, ref));
#endif
    return r;
  }
  ir = IR(ref);
  r = ir->r;
  lj_assertA(ra_hasreg(r), "rematk of K%03d has no reg", REF_BIAS - ref);
  lj_assertA(!ra_hasspill(ir->s),
	     "rematk of K%03d has spill slot [%x]", REF_BIAS - ref, ir->s);
  ra_free(as, r);
  ra_modified(as, r);
  ir->r = RID_INIT;  /* Do not keep any hint. */
  RA_DBGX((as, "remat     $i $r", ir, r));
#if !LJ_SOFTFP32
  if (ir->o == IR_KNUM) {
    emit_loadk64(as, r, ir);
  } else
#endif
  if (emit_canremat(REF_BASE) && ir->o == IR_BASE) {
    ra_sethint(ir->r, RID_BASE);  /* Restore BASE register hint. */
    emit_getgl(as, r, jit_base);
  } else if (emit_canremat(ASMREF_L) && ir->o == IR_KPRI) {
    /* REF_NIL stores ASMREF_L register. */
    lj_assertA(irt_isnil(ir->t), "rematk of bad ASMREF_L");
    emit_getgl(as, r, cur_L);
#if LJ_64
  } else if (ir->o == IR_KINT64) {
    emit_loadu64(as, r, ir_kint64(ir)->u64);
#if LJ_GC64
  } else if (ir->o == IR_KGC) {
    emit_loadu64(as, r, (uintptr_t)ir_kgc(ir));
  } else if (ir->o == IR_KPTR || ir->o == IR_KKPTR) {
    emit_loadu64(as, r, (uintptr_t)ir_kptr(ir));
#endif
#endif
  } else {
    lj_assertA(ir->o == IR_KINT || ir->o == IR_KGC ||
	       ir->o == IR_KPTR || ir->o == IR_KKPTR || ir->o == IR_KNULL,
	       "rematk of bad IR op %d", ir->o);
    emit_loadi(as, r, ir->i);
  }
  return r;
}